

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O0

void test_bhdct_get_all(planck_unit_test_t *tc)

{
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  undefined1 local_78 [4];
  int i;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  planck_unit_test_t *tc_local;
  
  bhdct_setup(tc,(ion_dictionary_handler_t *)&dict.handler,(ion_dictionary_t *)local_78,
              ion_fill_edge_cases);
  for (local_7c = 0; local_7c < 10; local_7c = local_7c + 1) {
    local_80 = local_7c;
    local_84 = local_7c << 1;
    bhdct_get(tc,(ion_dictionary_t *)local_78,&local_80,&local_84,'\0',1);
  }
  for (local_7c = 0x32; local_7c < 100; local_7c = local_7c + 2) {
    local_88 = local_7c;
    local_8c = local_7c * 5;
    bhdct_get(tc,(ion_dictionary_t *)local_78,&local_88,&local_8c,'\0',1);
  }
  for (local_7c = 500; local_7c < 1000; local_7c = local_7c + 5) {
    local_90 = local_7c;
    local_94 = local_7c * 10;
    bhdct_get(tc,(ion_dictionary_t *)local_78,&local_90,&local_94,'\0',1);
  }
  for (local_7c = -100; local_7c < -0x32; local_7c = local_7c + 2) {
    local_98 = local_7c;
    local_9c = local_7c * 3;
    bhdct_get(tc,(ion_dictionary_t *)local_78,&local_98,&local_9c,'\0',1);
  }
  bhdct_takedown(tc,(ion_dictionary_t *)local_78);
  return;
}

Assistant:

void
test_bhdct_get_all(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_edge_cases);

	int i;

	ION_FILL_LOW_LOOP(i) {
		bhdct_get(tc, &dict, IONIZE(i, int), ION_LOW_VALUE(i), err_ok, 1);
	}
	ION_FILL_MEDIUM_LOOP(i) {
		bhdct_get(tc, &dict, IONIZE(i, int), ION_MEDIUM_VALUE(i), err_ok, 1);
	}
	ION_FILL_HIGH_LOOP(i) {
		bhdct_get(tc, &dict, IONIZE(i, int), ION_HIGH_VALUE(i), err_ok, 1);
	}
	ION_FILL_EDGE_LOOP(i) {
		bhdct_get(tc, &dict, IONIZE(i, int), ION_EDGE_VALUE(i), err_ok, 1);
	}

	bhdct_takedown(tc, &dict);
}